

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  sqlite3 *db_00;
  int rc_00;
  sqlite3 *db;
  Vdbe *v;
  int rc;
  sqlite3_stmt *pStmt_local;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    v._4_4_ = 0;
  }
  else {
    db_00 = *(sqlite3 **)pStmt;
    sqlite3_mutex_enter(db_00->mutex);
    if (0 < *(long *)(pStmt + 0xb0)) {
      invokeProfileCallback(db_00,(Vdbe *)pStmt);
    }
    rc_00 = sqlite3VdbeReset((Vdbe *)pStmt);
    sqlite3VdbeRewind((Vdbe *)pStmt);
    v._4_4_ = sqlite3ApiExit(db_00,rc_00);
    sqlite3_mutex_leave(db_00->mutex);
  }
  return v._4_4_;
}

Assistant:

SQLITE_API int sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    sqlite3_mutex_enter(db->mutex);
    checkProfileCallback(db, v);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (db->errMask))==rc );
    rc = sqlite3ApiExit(db, rc);
    sqlite3_mutex_leave(db->mutex);
  }
  return rc;
}